

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O0

const_iterator __thiscall ser::MetainfoSet::checkKeyExists(MetainfoSet *this,string *key)

{
  bool bVar1;
  ostream *poVar2;
  SerializationException *this_00;
  string local_1f8;
  ostringstream local_1c8 [8];
  ostringstream ss;
  undefined1 local_50 [8];
  SerializationException exception;
  string *key_local;
  MetainfoSet *this_local;
  const_iterator iter;
  
  this_local = (MetainfoSet *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
               ::find(&this->data_,key);
  exception.message_.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
       ::end(&this->data_);
  bVar1 = std::operator==((_Self *)&this_local,(_Self *)((long)&exception.message_.field_2 + 8));
  if (!bVar1) {
    return (const_iterator)(_Base_ptr)this_local;
  }
  SerializationException::SerializationException((SerializationException *)local_50);
  std::__cxx11::ostringstream::ostringstream(local_1c8);
  poVar2 = std::operator<<((ostream *)local_1c8,"Error: Requested key ");
  poVar2 = std::operator<<(poVar2,(string *)key);
  std::operator<<(poVar2," is not in set\n");
  std::__cxx11::ostringstream::str();
  SerializationException::Init((SerializationException *)local_50,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_00,(SerializationException *)local_50);
  __cxa_throw(this_00,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

std::map<std::string, boost::any>::const_iterator MetainfoSet::checkKeyExists(const std::string& key) const
{
    std::map<std::string, boost::any>::const_iterator iter = data_.find(key);
    if (iter == data_.end())
    {
        SerializationException exception;
        std::ostringstream ss;
        ss << "Error: Requested key " << key << " is not in set\n";
        exception.Init(ss.str());
        throw exception;
    }
    return iter;
}